

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall GameEngine::applyLifeCycles(GameEngine *this)

{
  pointer psVar1;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Map *this_00;
  pointer psVar3;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *pvVar4;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  psVar1 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->players).
                super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    pvVar4 = Player::GetPlayerPopulations
                       ((psVar3->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    p_Var2 = &((pvVar4->
               super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var5 = &((pvVar4->
                    super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>; p_Var5 != p_Var2;
        p_Var5 = p_Var5 + 1) {
      Population::SetAvailableStep(p_Var5->_M_ptr,1);
      this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var5);
      Map::applyLifeCircle(this_00,(shared_ptr<Population> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
  }
  return;
}

Assistant:

void GameEngine::applyLifeCycles() {
  for (auto &player : players) {
    for (auto &population : player->GetPlayerPopulations()) {
      population->SetAvailableStep(1);
      map->applyLifeCircle(population);
    }
  }
}